

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

void __thiscall re2::Regexp::ParseState::DoCollapse(ParseState *this,RegexpOp op)

{
  bool bVar1;
  Regexp **sub;
  long lVar2;
  Regexp *pRVar3;
  undefined1 uVar4;
  uint uVar5;
  ulong uVar6;
  Regexp **ppRVar7;
  ParseState *pPVar8;
  ParseState *re;
  StringPiece *pSVar9;
  ParseState *pPVar10;
  uint nsub;
  uint local_50;
  
  re = (ParseState *)this->stacktop_;
  if (re == (ParseState *)0x0) {
    nsub = 0;
LAB_00138460:
    sub = (Regexp **)operator_new__((ulong)nsub << 3);
  }
  else {
    uVar4 = (undefined1)re->flags_;
    if ((byte)uVar4 < (OneLine|ClassNL|Literal)) {
      nsub = 0;
      pPVar8 = re;
      do {
        uVar5 = 1;
        if ((byte)uVar4 == op) {
          uVar5 = (uint)*(ushort *)&pPVar8->field_0x6;
        }
        nsub = nsub + uVar5;
        pPVar8 = (ParseState *)
                 ((anon_union_8_2_3df47e5c_for_Regexp_7 *)&pPVar8->whole_regexp_)[1].submany_;
        if (pPVar8 == (ParseState *)0x0) {
          pPVar8 = (ParseState *)0x0;
          break;
        }
        uVar4 = (undefined1)pPVar8->flags_;
      } while ((byte)uVar4 < (OneLine|ClassNL|Literal));
    }
    else {
      pPVar8 = (ParseState *)0x0;
      nsub = 0;
    }
    if (re == (ParseState *)0x0) goto LAB_00138460;
    if ((ParseState *)((anon_union_8_2_3df47e5c_for_Regexp_7 *)&re->whole_regexp_)[1].submany_ ==
        pPVar8) {
      return;
    }
    pPVar8 = (ParseState *)((ulong)nsub << 3);
    sub = (Regexp **)operator_new__((ulong)pPVar8);
    uVar4 = (undefined1)re->flags_;
    local_50 = nsub;
    if ((byte)uVar4 < (OneLine|ClassNL|Literal)) {
      do {
        pPVar10 = *(ParseState **)&(re->whole_regexp_).length_;
        if ((byte)uVar4 == op) {
          uVar6 = (ulong)*(ushort *)&re->field_0x6;
          if (uVar6 < 2) {
            pSVar9 = &re->whole_regexp_;
          }
          else {
            pSVar9 = (StringPiece *)(re->whole_regexp_).ptr_;
          }
          if (uVar6 != 0) {
            ppRVar7 = sub + (long)(int)local_50 + -1;
            uVar6 = uVar6 + 1;
            local_50 = local_50 - *(ushort *)&re->field_0x6;
            do {
              pRVar3 = Incref(*(Regexp **)((long)(pSVar9 + -1) + uVar6 * 8));
              *ppRVar7 = pRVar3;
              ppRVar7 = ppRVar7 + -1;
              uVar6 = uVar6 - 1;
            } while (1 < uVar6);
          }
          Decref((Regexp *)re);
          pPVar8 = re;
        }
        else {
          FinishRegexp(pPVar8,(Regexp *)re);
          lVar2 = (long)(int)local_50;
          local_50 = local_50 - 1;
          sub[lVar2 + -1] = (Regexp *)re;
        }
        if (pPVar10 == (ParseState *)0x0) goto LAB_0013846f;
        uVar4 = (undefined1)pPVar10->flags_;
        re = pPVar10;
      } while ((byte)uVar4 < (OneLine|ClassNL|Literal));
      goto LAB_00138472;
    }
  }
LAB_0013846f:
  pPVar10 = (ParseState *)0x0;
LAB_00138472:
  pRVar3 = ConcatOrAlternate(op,sub,nsub,this->flags_,true);
  operator_delete__(sub);
  bVar1 = ComputeSimple(pRVar3);
  pRVar3->simple_ = bVar1;
  pRVar3->down_ = (Regexp *)pPVar10;
  this->stacktop_ = pRVar3;
  return;
}

Assistant:

void Regexp::ParseState::DoCollapse(RegexpOp op) {
  // Scan backward to marker, counting children of composite.
  int n = 0;
  Regexp* next = NULL;
  Regexp* sub;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op)
      n += sub->nsub_;
    else
      n++;
  }

  // If there's just one child, leave it alone.
  // (Concat of one thing is that one thing; alternate of one thing is same.)
  if (stacktop_ != NULL && stacktop_->down_ == next)
    return;

  // Construct op (alternation or concatenation), flattening op of op.
  Regexp** subs = new Regexp*[n];
  next = NULL;
  int i = n;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op) {
      Regexp** sub_subs = sub->sub();
      for (int k = sub->nsub_ - 1; k >= 0; k--)
        subs[--i] = sub_subs[k]->Incref();
      sub->Decref();
    } else {
      subs[--i] = FinishRegexp(sub);
    }
  }

  Regexp* re = ConcatOrAlternate(op, subs, n, flags_, true);
  delete[] subs;
  re->simple_ = re->ComputeSimple();
  re->down_ = next;
  stacktop_ = re;
}